

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitUseBeforeDeclaration(Symbol *sym,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  bool bVar1;
  
  if ((sym != (Symbol *)0x0) && ((*(ushort *)&sym->field_0x42 & 0x4001) == 1)) {
    bVar1 = Scope::HasStaticPathToAncestor(byteCodeGenerator->currentScope,sym->scope);
    if ((bVar1) && (sym->scope->func == funcInfo)) {
      Js::ByteCodeWriter::W1(&byteCodeGenerator->m_writer,RuntimeReferenceError,0x13f9);
      return;
    }
  }
  return;
}

Assistant:

void EmitUseBeforeDeclaration(Symbol *sym, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    // Don't emit static use-before-declaration error in a closure or dynamic scope case. We detect such cases with dynamic checks,
    // if necessary.
    if (sym != nullptr &&
        !sym->GetIsModuleExportStorage() &&
        sym->GetNeedDeclaration() &&
        byteCodeGenerator->GetCurrentScope()->HasStaticPathToAncestor(sym->GetScope()) &&
        sym->GetScope()->GetFunc() == funcInfo)
    {
        EmitUseBeforeDeclarationRuntimeError(byteCodeGenerator, Js::Constants::NoRegister);
    }
}